

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

vector<xmrig::String,_std::allocator<xmrig::String>_> * __thiscall
xmrig::String::split
          (vector<xmrig::String,_std::allocator<xmrig::String>_> *__return_storage_ptr__,
          String *this,char sep)

{
  long lVar1;
  ulong uVar2;
  unsigned_long local_40;
  char *local_38;
  
  (__return_storage_ptr__->super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_size != 0) {
    if (this->m_size == 0) {
      lVar1 = 0;
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      lVar1 = 0;
      do {
        if (this->m_data[uVar2] == sep) {
          local_40 = uVar2 - lVar1;
          if (local_40 != 0) {
            local_38 = this->m_data + lVar1;
            std::vector<xmrig::String,std::allocator<xmrig::String>>::
            emplace_back<char*,unsigned_long>
                      ((vector<xmrig::String,std::allocator<xmrig::String>> *)__return_storage_ptr__
                       ,&local_38,&local_40);
          }
          lVar1 = uVar2 + 1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->m_size);
    }
    local_40 = uVar2 - lVar1;
    if (local_40 != 0) {
      local_38 = this->m_data + lVar1;
      std::vector<xmrig::String,std::allocator<xmrig::String>>::emplace_back<char*,unsigned_long>
                ((vector<xmrig::String,std::allocator<xmrig::String>> *)__return_storage_ptr__,
                 &local_38,&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<xmrig::String> xmrig::String::split(char sep) const
{
    std::vector<xmrig::String> out;
    if (m_size == 0) {
        return out;
    }

    size_t start = 0;
    size_t pos   = 0;

    for (pos = 0; pos < m_size; ++pos) {
        if (m_data[pos] == sep) {
            if ((pos - start) > 0) {
                out.emplace_back(m_data + start, pos - start);
            }

            start = pos + 1;
        }
    }

    if ((pos - start) > 0) {
        out.emplace_back(m_data + start, pos - start);
    }

    return out;
}